

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard_mt.cpp
# Opt level: O0

void __thiscall
xcardMT::runnerLS(xcardMT *this,longlong start,longlong end,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *result)

{
  bool bVar1;
  ostream *poVar2;
  __cxx11 local_88 [48];
  __cxx11 local_58 [8];
  string card;
  longlong local_38;
  longlong i;
  int countdown;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result_local;
  longlong end_local;
  longlong start_local;
  xcardMT *this_local;
  
  i._4_4_ = 10;
  for (local_38 = start; local_38 < end; local_38 = local_38 + 1) {
    std::__cxx11::to_string(local_58,local_38);
    bVar1 = xcard::LuhnCheck(&this->super_xcard,(string *)local_58);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(result,(value_type *)local_58);
      if ((this->super_xcard).debug != 0) {
        std::mutex::lock(&mutex);
        poVar2 = std::operator<<((ostream *)&std::cout,"[VALID] ");
        poVar2 = std::operator<<(poVar2,(string *)local_58);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::mutex::unlock(&mutex);
      }
    }
    else {
      std::__cxx11::to_string(local_88,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(result,(value_type *)local_88);
      std::__cxx11::string::~string((string *)local_88);
    }
    i._4_4_ = i._4_4_ + -1;
    if (i._4_4_ == 0) {
      i._4_4_ = 10;
    }
    std::__cxx11::string::~string((string *)local_58);
  }
  return;
}

Assistant:

void xcardMT::runnerLS(long long int start, long long int end, std::vector<std::string> *result)
{

    int countdown = 10;

    for (long long int i = start; i < end; i++)
    {

        std::string card = std::to_string(i);

        if (LuhnCheck(card) == true)
        {
            result->push_back(card);
            if (this->debug){
                mutex.lock();
                std::cout << "[VALID] " << card << std::endl;
                mutex.unlock();
            }
        }
        else{
            result->push_back(std::to_string(false));
        }

        countdown--;

        if (countdown == 0)
        {
            //reset
            countdown = 10;
        }
    }
}